

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

void __thiscall SQVM::Raise_Error(SQVM *this,SQChar *s,...)

{
  char in_AL;
  SQChar *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  SQSharedState *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  SQInteger buffersize;
  va_list vl;
  SQInteger len;
  SQInteger in_stack_ffffffffffffff08;
  SQString *x;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  size_t local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  SQSharedState *local_8;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_18 = local_e8;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = strlen(in_RSI);
  local_30 = local_30 + 100;
  __s = SQSharedState::GetScratchPad(in_RDI,in_stack_ffffffffffffff08);
  vsnprintf(__s,local_30,local_10,&local_28);
  len = (in_RDI->_class_default_delegate).super_SQObject._unVal.nInteger;
  x = (SQString *)0xffffffffffffffff;
  SQSharedState::GetScratchPad(in_RDI,-1);
  SQString::Create(in_RDI,(SQChar *)x,len);
  ::SQObjectPtr::operator=((SQObjectPtr *)in_RDI,x);
  return;
}

Assistant:

void SQVM::Raise_Error(const SQChar *s, ...)
{
    va_list vl;
    va_start(vl, s);
    SQInteger buffersize = (SQInteger)scstrlen(s)+(NUMBER_MAX_CHAR*2);
    scvsprintf(_sp(sq_rsl(buffersize)),buffersize, s, vl);
    va_end(vl);
    _lasterror = SQString::Create(_ss(this),_spval,-1);
}